

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

Offset dg::pta::accumulateEVOffsets(ExtractValueInst *EV,DataLayout *DL)

{
  uint uVar1;
  long lVar2;
  Type *pTVar3;
  ulong uVar4;
  long lVar5;
  Offset o;
  ulong uVar6;
  long lVar7;
  TypeSize TVar8;
  Offset off;
  Offset local_48;
  TypeSize local_40;
  
  local_48.offset = 0;
  lVar2 = *(long *)(EV + 0x40);
  pTVar3 = (Type *)**(undefined8 **)(EV + -0x20);
  uVar1 = *(uint *)(EV + 0x48);
  lVar7 = 0;
  do {
    if ((ulong)uVar1 << 2 == lVar7) {
      return (Offset)local_48.offset;
    }
    uVar6 = (ulong)*(uint *)(lVar2 + lVar7);
    if (pTVar3[8] == (Type)0x10 && pTVar3 != (Type *)0x0) {
      lVar5 = llvm::DataLayout::getStructLayout((StructType *)DL);
      o.offset = *(type *)(lVar5 + 0x10 + uVar6 * 8);
    }
    else {
      TVar8 = llvm::DataLayout::getTypeAllocSize(DL,*(Type **)(pTVar3 + 0x18));
      local_40.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
      Value = TVar8.super_LinearPolySize<llvm::TypeSize>.
              super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
      local_40.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
      UnivariateDim =
           TVar8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>
           .UnivariateDim;
      uVar4 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_40);
      o.offset = uVar4 + uVar6;
    }
    Offset::operator+=(&local_48,o);
    lVar5 = llvm::GetElementPtrInst::getTypeAtIndex(pTVar3,uVar6);
    lVar7 = lVar7 + 4;
  } while (lVar5 != 0);
  return (Offset)local_48.offset;
}

Assistant:

Offset accumulateEVOffsets(const llvm::ExtractValueInst *EV,
                           const llvm::DataLayout &DL) {
    Offset off{0};
#if LLVM_VERSION_MAJOR >= 11
    llvm::Type *type = EV->getAggregateOperand()->getType();
#else
    llvm::CompositeType *type = llvm::dyn_cast<llvm::CompositeType>(
            EV->getAggregateOperand()->getType());
    assert(type && "Don't have composite type in extractvalue");
#endif

    for (unsigned idx : EV->getIndices()) {
        if (llvm::StructType *STy = llvm::dyn_cast<llvm::StructType>(type)) {
            assert(STy->indexValid(idx) && "Invalid index");
            const llvm::StructLayout *SL = DL.getStructLayout(STy);
            off += SL->getElementOffset(idx);
        } else {
            // array or vector, so just move in the array
            if (auto *arrTy = llvm::dyn_cast<llvm::ArrayType>(type)) {
                assert(idx < arrTy->getNumElements() && "Invalid index");
                off += idx + DL.getTypeAllocSize(arrTy->getElementType());
            } else {
                auto *vecTy = llvm::cast<llvm::VectorType>(type);
#if LLVM_VERSION_MAJOR >= 12
                assert(idx < vecTy->getElementCount().getFixedValue() &&
                       "Invalid index");
#else
                assert(idx < vecTy->getNumElements() && "Invalid index");
#endif
                off += idx + DL.getTypeAllocSize(vecTy->getElementType());
            }
        }

#if LLVM_VERSION_MAJOR >= 11
        if (!llvm::GetElementPtrInst::getTypeAtIndex(type, idx))
#else
        if (!llvm::dyn_cast<llvm::CompositeType>(type->getTypeAtIndex(idx)))
#endif
            break; // we're done
    }

    return off;
}